

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::fieldidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,
          _Optional_base<unsigned_int,_true,_true> ctx)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  uint *puVar3;
  Name *pNVar4;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  size_t local_60;
  char *local_58;
  Ok local_49;
  undefined1 local_48 [8];
  optional<wasm::Name> id;
  _Optional_payload_base<unsigned_int> local_28;
  optional<unsigned_int> x;
  ParseDeclsCtx *ctx_local;
  
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (_Optional_base<unsigned_int,_true,_true>)
       ctx._M_payload.super__Optional_payload_base<unsigned_int>;
  local_28 = (_Optional_payload_base<unsigned_int>)
             ParseInput::takeU32((ParseInput *)
                                 ctx._M_payload.super__Optional_payload_base<unsigned_int>);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_28);
  oVar1 = x;
  if (bVar2) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_28);
    NullInstrParserCtx::getFieldFromIdx<wasm::WATParser::Ok>
              ((NullInstrParserCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,*puVar3);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>
              (__return_storage_ptr__,
               (Ok *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>.field_0x17);
  }
  else {
    ParseInput::takeID((optional<wasm::Name> *)local_48,
                       (ParseInput *)
                       x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_48);
    oVar1 = x;
    if (bVar2) {
      pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
      local_60 = (pNVar4->super_IString).str._M_len;
      local_58 = (pNVar4->super_IString).str._M_str;
      NullInstrParserCtx::getFieldFromName<wasm::WATParser::Ok>
                ((NullInstrParserCtx *)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>,local_60,local_58);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_49);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"expected field index or identifier",&local_a9);
      ParseInput::err(&local_88,
                      (ParseInput *)
                      oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>,&local_a8);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_88);
      WATParser::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}